

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O2

void ncnn::draw_text_c3(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uchar *resized_font_bitmap;
  size_t sVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  ulong uVar11;
  byte *pbVar12;
  ulong uVar13;
  byte *pbVar14;
  int iVar15;
  ulong uVar16;
  int k;
  
  uVar11 = (ulong)(uint)x;
  iVar15 = fontpixelsize * 2;
  resized_font_bitmap = (uchar *)operator_new__((ulong)(uint)(iVar15 * fontpixelsize));
  sVar5 = strlen(text);
  uVar8 = 0;
  uVar7 = sVar5 & 0xffffffff;
  if ((int)sVar5 < 1) {
    uVar7 = uVar8;
  }
  for (; uVar8 != uVar7; uVar8 = uVar8 + 1) {
    cVar1 = text[uVar8];
    iVar9 = (int)uVar11;
    if (cVar1 == ' ') {
      uVar11 = (ulong)(uint)(iVar9 + fontpixelsize);
    }
    else if (cVar1 == '\n') {
      y = y + iVar15;
      uVar11 = (ulong)(uint)x;
    }
    else {
      iVar4 = isprint((int)cVar1);
      if (iVar4 != 0) {
        resize_bilinear_font
                  ((uchar *)((long)cVar1 * 400 + 0x5394a0),resized_font_bitmap,fontpixelsize);
        uVar16 = 0;
        if (0 < y) {
          uVar16 = (ulong)(uint)y;
        }
        iVar4 = iVar15 + y;
        if (h <= iVar15 + y) {
          iVar4 = h;
        }
        uVar13 = 0;
        if (0 < iVar9) {
          uVar13 = uVar11;
        }
        uVar6 = iVar9 + fontpixelsize;
        uVar3 = w;
        if ((int)uVar6 < w) {
          uVar3 = uVar6;
        }
        for (; (long)uVar16 < (long)iVar4; uVar16 = uVar16 + 1) {
          pbVar14 = resized_font_bitmap +
                    (uVar16 - (long)y) * (long)fontpixelsize + (uVar13 - (long)iVar9);
          pbVar12 = pixels + uVar16 * (long)stride + (ulong)(uint)((int)uVar13 * 3);
          for (uVar11 = uVar13; (int)uVar11 < (int)uVar3; uVar11 = (ulong)((int)uVar11 + 1)) {
            bVar2 = *pbVar14;
            pbVar14 = pbVar14 + 1;
            uVar10 = bVar2 ^ 0xff;
            *pbVar12 = (byte)((ulong)((color & 0xff) * (uint)bVar2 + *pbVar12 * uVar10) / 0xff);
            pbVar12[1] = (byte)((ulong)((color >> 8 & 0xff) * (uint)bVar2 + pbVar12[1] * uVar10) /
                               0xff);
            pbVar12[2] = (byte)((ulong)((uint)bVar2 * (color >> 0x10 & 0xff) + pbVar12[2] * uVar10)
                               / 0xff);
            pbVar12 = pbVar12 + 3;
          }
        }
        uVar11 = (ulong)uVar6;
      }
    }
  }
  operator_delete__(resized_font_bitmap);
  return;
}

Assistant:

void draw_text_c3(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 3;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p[2] = (p[2] * (255 - alpha) + pen_color[2] * alpha) / 255;
                    p += 3;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}